

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

void lodepng::mulMatrixMatrix(float *result,float *a,float *b)

{
  float temp [9];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28 [2];
  
  mulMatrix((float *)&local_48,(float *)((long)&uStack_40 + 4),(float *)&uStack_30,a,(double)*b,
            (double)b[3],(double)b[6]);
  mulMatrix((float *)((long)&local_48 + 4),(float *)&local_38,(float *)((long)&uStack_30 + 4),a,
            (double)b[1],(double)b[4],(double)b[7]);
  mulMatrix((float *)&uStack_40,(float *)((long)&local_38 + 4),local_28,a,(double)b[2],(double)b[5],
            (double)b[8]);
  result[8] = local_28[0];
  *(undefined8 *)(result + 4) = local_38;
  *(undefined8 *)(result + 6) = uStack_30;
  *(undefined8 *)result = local_48;
  *(undefined8 *)(result + 2) = uStack_40;
  return;
}

Assistant:

static void mulMatrixMatrix(float* result, const float* a, const float* b) {
  int i;
  float temp[9]; /* temp is to allow result and a or b to be the same */
  mulMatrix(&temp[0], &temp[3], &temp[6], a, b[0], b[3], b[6]);
  mulMatrix(&temp[1], &temp[4], &temp[7], a, b[1], b[4], b[7]);
  mulMatrix(&temp[2], &temp[5], &temp[8], a, b[2], b[5], b[8]);
  for(i = 0; i < 9; i++) result[i] = temp[i];
}